

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_GetNumberOfFonts_internal(uchar *font_collection)

{
  int iVar1;
  stbtt_uint32 sVar2;
  uchar *font_collection_local;
  
  iVar1 = stbtt__isfont(font_collection);
  if (iVar1 == 0) {
    if ((((*font_collection == 't') && (font_collection[1] == 't')) && (font_collection[2] == 'c'))
       && ((font_collection[3] == 'f' &&
           ((sVar2 = ttULONG(font_collection + 4), sVar2 == 0x10000 ||
            (sVar2 = ttULONG(font_collection + 4), sVar2 == 0x20000)))))) {
      font_collection_local._4_4_ = ttLONG(font_collection + 8);
    }
    else {
      font_collection_local._4_4_ = 0;
    }
  }
  else {
    font_collection_local._4_4_ = 1;
  }
  return font_collection_local._4_4_;
}

Assistant:

static int stbtt_GetNumberOfFonts_internal(unsigned char *font_collection)
{
   // if it's just a font, there's only one valid font
   if (stbtt__isfont(font_collection))
      return 1;

   // check if it's a TTC
   if (stbtt_tag(font_collection, "ttcf")) {
      // version 1?
      if (ttULONG(font_collection+4) == 0x00010000 || ttULONG(font_collection+4) == 0x00020000) {
         return ttLONG(font_collection+8);
      }
   }
   return 0;
}